

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
SharedPtrTests_misc_ResetEmpty_Test::TestBody(SharedPtrTests_misc_ResetEmpty_Test *this)

{
  char *pcVar1;
  AssertHelper local_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar;
  SharedPtr<int> local_28;
  SharedPtr<int> t2;
  
  local_28.data = (int *)operator_new(4);
  *local_28.data = 0x4d2;
  local_28.pointersAmount = (atomic<unsigned_long> *)operator_new(8);
  LOCK();
  ((local_28.pointersAmount)->super___atomic_base<unsigned_long>)._M_i = 1;
  UNLOCK();
  SharedPtr<int>::SharedPtr(&t2,&local_28);
  SharedPtr<int>::reset(&local_28,(int *)0x0);
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28.data;
  local_48.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<int*,decltype(nullptr)>
            ((internal *)&gtest_ar,"t1.get()","nullptr",(int **)&local_40,&local_48.data_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x59,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (local_28.pointersAmount == (atomic<unsigned_long> *)0x0) {
    local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_40.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((local_28.pointersAmount)->super___atomic_base<unsigned_long>)._M_i;
  }
  local_48.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"t1.use_count()","1",(unsigned_long *)&local_40,(int *)&local_48)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (t2.pointersAmount == (atomic<unsigned_long> *)0x0) {
    local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_40.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((t2.pointersAmount)->super___atomic_base<unsigned_long>)._M_i;
  }
  local_48.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"t2.use_count()","1",(unsigned_long *)&local_40,(int *)&local_48)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  SharedPtr<int>::~SharedPtr(&t2);
  SharedPtr<int>::~SharedPtr(&local_28);
  return;
}

Assistant:

TEST(SharedPtrTests_misc, ResetEmpty) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(t1);
	t1.reset();
	EXPECT_EQ(t1.get(), nullptr);
	EXPECT_EQ(t1.use_count(),1);
	EXPECT_EQ(t2.use_count(),1);
}